

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read.c
# Opt level: O3

XML_Char * xlsxioread_sheet_next_cell(xlsxioreadersheet sheethandle)

{
  XML_Status XVar1;
  ulong uVar2;
  XML_Char *pXVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  size_t sVar7;
  
  if (sheethandle == (xlsxioreadersheet)0x0) {
    return (XML_Char *)0x0;
  }
  uVar5 = (sheethandle->processcallbackdata).flags;
  do {
    if (((uVar5 & 2) == 0) && (uVar2 = sheethandle->paddingcol, uVar2 != 0)) {
      uVar6 = (sheethandle->processcallbackdata).cols;
      if (uVar6 < uVar2) {
        sVar7 = sheethandle->paddingrow;
        sheethandle->paddingcol = 0;
        if (sVar7 == 0) {
          return (XML_Char *)0x0;
        }
LAB_001055b8:
        sheethandle->lastrownr = sheethandle->lastrownr + 1;
        sheethandle->paddingrow = sVar7 + 1;
        if ((sheethandle->processcallbackdata).rownr <= sVar7 + 2) {
          return (XML_Char *)0x0;
        }
        sheethandle->paddingcol = 1;
        return (XML_Char *)0x0;
      }
LAB_001055e1:
      if (uVar6 <= sheethandle->lastcolnr && (uVar6 != 0 && (uVar5 & 4) != 0)) {
        return (XML_Char *)0x0;
      }
      sheethandle->paddingcol = uVar2 + 1;
      sheethandle->lastcolnr = sheethandle->lastcolnr + 1;
LAB_0010561a:
      pcVar4 = strdup("");
      return pcVar4;
    }
    if (((uVar5 & 1) == 0) && (sVar7 = sheethandle->paddingrow, sVar7 != 0)) {
      uVar6 = (sheethandle->processcallbackdata).cols;
      uVar2 = sheethandle->paddingcol;
      if ((uVar5 & 2) != 0 || uVar6 < uVar2) {
        sheethandle->paddingcol = 0;
        goto LAB_001055b8;
      }
      goto LAB_001055e1;
    }
    if ((((uVar5 & 4) != 0) && (uVar2 = (sheethandle->processcallbackdata).cols, uVar2 != 0)) &&
       (uVar2 <= sheethandle->lastcolnr)) {
      return (XML_Char *)0x0;
    }
    if (((sheethandle->processcallbackdata).celldata == (XML_Char *)0x0) &&
       (XVar1 = expat_process_zip_file_resume
                          (sheethandle->zipfile,(sheethandle->processcallbackdata).xmlparser),
       XVar1 != XML_STATUS_SUSPENDED)) {
      (sheethandle->processcallbackdata).celldata = (XML_Char *)0x0;
    }
    uVar5 = (sheethandle->processcallbackdata).flags;
    if (((uVar5 & 1) == 0) &&
       (uVar2 = sheethandle->lastrownr + 1, uVar2 < (sheethandle->processcallbackdata).rownr)) {
      sheethandle->paddingrow = uVar2;
      uVar6 = 1;
    }
    else {
      if ((uVar5 & 2) != 0) {
        pXVar3 = (sheethandle->processcallbackdata).celldata;
        (sheethandle->processcallbackdata).celldata = (XML_Char *)0x0;
        if (pXVar3 != (XML_Char *)0x0) goto LAB_0010554e;
        sheethandle->lastrownr = (sheethandle->processcallbackdata).rownr;
LAB_0010554c:
        pXVar3 = (XML_Char *)0x0;
LAB_0010554e:
        sheethandle->lastcolnr = (sheethandle->processcallbackdata).colnr;
        return pXVar3;
      }
      uVar2 = (sheethandle->processcallbackdata).colnr;
      uVar6 = sheethandle->lastcolnr + 1;
      if (uVar6 < uVar2) {
        sheethandle->lastcolnr = uVar6;
        goto LAB_0010561a;
      }
      pXVar3 = (sheethandle->processcallbackdata).celldata;
      (sheethandle->processcallbackdata).celldata = (XML_Char *)0x0;
      if (pXVar3 != (XML_Char *)0x0) goto LAB_0010554e;
      sheethandle->lastrownr = (sheethandle->processcallbackdata).rownr;
      if ((sheethandle->processcallbackdata).cols <= uVar2) goto LAB_0010554c;
    }
    sheethandle->paddingcol = uVar6;
  } while( true );
}

Assistant:

DLL_EXPORT_XLSXIO XLSXIOCHAR* xlsxioread_sheet_next_cell (xlsxioreadersheet sheethandle)
{
  XML_Char* result;
  if (!sheethandle)
    return NULL;
  //if (!(sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EMPTY_CELLS) && sheethandle->paddingcol) {
  if ((!(sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EMPTY_CELLS) && sheethandle->paddingcol) || (!(sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EMPTY_ROWS) && sheethandle->paddingrow)) {
    if ((/*sheethandle->processcallbackdata.cols > 0 &&*/ sheethandle->paddingcol > sheethandle->processcallbackdata.cols) || (sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EMPTY_CELLS)) {
      //last empty column added, finish row
      sheethandle->paddingcol = 0;
      //when padding rows prepare for the next one
      if (sheethandle->paddingrow) {
        sheethandle->lastrownr++;
        sheethandle->paddingrow++;
        if (sheethandle->paddingrow + 1 < sheethandle->processcallbackdata.rownr) {
          sheethandle->paddingcol = 1;
        }
      }
      return NULL;
    } else if ((sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EXTRA_CELLS) && sheethandle->processcallbackdata.cols > 0 && sheethandle->lastcolnr >= sheethandle->processcallbackdata.cols) {
      //end of line when out of bounds
      return NULL;
    } else {
      //add another empty column
      sheethandle->paddingcol++;
      sheethandle->lastcolnr++;
      return XML_Char_dup(X(""));
    }
  } else if ((sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EXTRA_CELLS) && sheethandle->processcallbackdata.cols > 0 && sheethandle->lastcolnr >= sheethandle->processcallbackdata.cols) {
    //end of line when out of bounds
    return NULL;
  }
  //get value
  if (!sheethandle->processcallbackdata.celldata)
    if (expat_process_zip_file_resume(sheethandle->zipfile, sheethandle->processcallbackdata.xmlparser) != XML_STATUS_SUSPENDED)
      sheethandle->processcallbackdata.celldata = NULL;
  //insert empty rows if needed
  if (!(sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EMPTY_ROWS) && sheethandle->lastrownr + 1 < sheethandle->processcallbackdata.rownr) {
    sheethandle->paddingrow = sheethandle->lastrownr + 1;
    sheethandle->paddingcol = sheethandle->processcallbackdata.colnr*0 + 1;
    return xlsxioread_sheet_next_cell(sheethandle);
  }
  //insert empty column before if needed
  if (!(sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EMPTY_CELLS)) {
    if (sheethandle->lastcolnr + 1 < sheethandle->processcallbackdata.colnr) {
      if (0) {
      //if ((sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EXTRA_CELLS) && sheethandle->processcallbackdata.cols > 0 && sheethandle->lastcolnr >= sheethandle->processcallbackdata.cols) {
        //end of line when out of bounds
        return NULL;
      } else {
        sheethandle->lastcolnr++;
        return XML_Char_dup(X(""));
      }
    }
  }
  result = sheethandle->processcallbackdata.celldata;
  sheethandle->processcallbackdata.celldata = NULL;
  //end of row
  if (!result) {
    sheethandle->lastrownr = sheethandle->processcallbackdata.rownr;
    //insert empty column at end of row if needed
    if (!(sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EMPTY_CELLS) && sheethandle->processcallbackdata.colnr < sheethandle->processcallbackdata.cols) {
      sheethandle->paddingcol = sheethandle->lastcolnr + 1;
      return xlsxioread_sheet_next_cell(sheethandle);
    }
  }
  sheethandle->lastcolnr = sheethandle->processcallbackdata.colnr;
  return result;
}